

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepTiledInputFile::getTileOrder(DeepTiledInputFile *this,int *dx,int *dy,int *lx,int *ly)

{
  exr_tile_level_mode_t eVar1;
  element_type *peVar2;
  long lVar3;
  pointer ptVar4;
  pointer ptVar5;
  exr_lineorder_t eVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  tilepos *__first;
  ArgExc *pAVar13;
  allocator<Imf_3_4::(anonymous_namespace)::tilepos> *extraout_RDX;
  size_t __n;
  int iVar14;
  __normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos_*,_std::vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>_>
  __i;
  pointer ptVar15;
  int *piVar16;
  int iVar17;
  ulong uVar18;
  int i_lx;
  long local_e0;
  ulong local_d8;
  vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
  table;
  exr_chunk_info_t cinfo;
  
  eVar6 = Context::lineOrder(&this->_ctxt,
                             ((this->_data).
                              super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->partNumber);
  if (eVar6 == EXR_LINEORDER_INCREASING_Y) {
    *dx = 0;
    *dy = 0;
  }
  else {
    if (eVar6 == EXR_LINEORDER_RANDOM_Y) {
      peVar2 = (this->_data).
               super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar7 = peVar2->num_x_levels;
      iVar10 = peVar2->num_y_levels;
      if (peVar2->tile_level_mode < EXR_TILE_RIPMAP_LEVELS) {
        iVar14 = 0;
        iVar11 = 0;
        if (0 < iVar10) {
          iVar11 = iVar10;
        }
        local_d8 = 0;
        for (; iVar11 != iVar14; iVar14 = iVar14 + 1) {
          iVar8 = numXTiles(this,iVar14);
          iVar9 = numYTiles(this,iVar14);
          local_d8 = local_d8 + (long)iVar9 * (long)iVar8;
        }
      }
      else {
        if (peVar2->tile_level_mode != EXR_TILE_RIPMAP_LEVELS) {
          pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar13,"Unknown LevelMode format.");
          goto LAB_001711a8;
        }
        iVar14 = 0;
        iVar11 = 0;
        if (0 < iVar7) {
          iVar11 = iVar7;
        }
        iVar8 = 0;
        if (0 < iVar10) {
          iVar8 = iVar10;
        }
        local_d8 = 0;
        for (; iVar14 != iVar8; iVar14 = iVar14 + 1) {
          for (iVar9 = 0; iVar11 != iVar9; iVar9 = iVar9 + 1) {
            iVar17 = numXTiles(this,iVar9);
            iVar12 = numYTiles(this,iVar14);
            local_d8 = local_d8 + (long)iVar12 * (long)iVar17;
          }
        }
      }
      table.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      table.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      table.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_d8 != 0) {
        if (0x555555555555555 < local_d8) {
          std::__throw_length_error("vector::_M_default_append");
        }
        __first = (tilepos *)operator_new(local_d8 * 0x18);
        std::
        __uninitialized_default_n_a<Imf_3_4::(anonymous_namespace)::tilepos*,unsigned_long,Imf_3_4::(anonymous_namespace)::tilepos>
                  (__first,local_d8,extraout_RDX);
        std::
        _Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
        ::_M_deallocate((_Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
                         *)0x0,(pointer)0x0,__n);
        table.
        super__Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = __first + local_d8;
        table.
        super__Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
        ._M_impl.super__Vector_impl_data._M_start = __first;
      }
      ptVar5 = table.
               super__Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ptVar4 = table.
               super__Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
               ._M_impl.super__Vector_impl_data._M_start;
      eVar1 = ((this->_data).
               super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->tile_level_mode;
      table.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           table.
           super__Vector_base<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (eVar1 < EXR_TILE_RIPMAP_LEVELS) {
        iVar7 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        local_e0 = 0;
        for (; iVar7 != iVar10; iVar7 = iVar7 + 1) {
          iVar14 = numYTiles(this,iVar7);
          iVar11 = numXTiles(this,iVar7);
          iVar8 = 0;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          if (iVar14 < 1) {
            iVar14 = iVar8;
          }
          for (; iVar8 != iVar14; iVar8 = iVar8 + 1) {
            piVar16 = &ptVar4[local_e0].ly;
            for (uVar18 = 0; iVar11 != (int)uVar18; uVar18 = uVar18 + 1) {
              iVar9 = exr_read_tile_chunk_info
                                (*(this->_ctxt)._ctxt.
                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,((this->_data).
                                           super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->partNumber,uVar18 & 0xffffffff,iVar8,iVar7,iVar7
                                 ,&cinfo);
              if (iVar9 != 0) {
                pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::ArgExc::ArgExc(pAVar13,"Unable to get tile offset.");
                __cxa_throw(pAVar13,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
              }
              ((tilepos *)(piVar16 + -5))->filePos = cinfo.data_offset;
              piVar16[-3] = (int)uVar18;
              piVar16[-2] = iVar8;
              piVar16[-1] = iVar7;
              *piVar16 = iVar7;
              piVar16 = piVar16 + 6;
            }
            local_e0 = local_e0 + uVar18;
          }
        }
      }
      else {
        if (eVar1 != EXR_TILE_RIPMAP_LEVELS) {
          pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar13,"Unknown LevelMode format.");
          __cxa_throw(pAVar13,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        local_e0 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        for (iVar11 = 0; iVar11 != iVar10; iVar11 = iVar11 + 1) {
          iVar14 = numYTiles(this,iVar11);
          iVar8 = 0;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          for (; iVar8 != iVar7; iVar8 = iVar8 + 1) {
            iVar9 = numXTiles(this,iVar8);
            iVar17 = 0;
            if (iVar9 < 1) {
              iVar9 = 0;
            }
            for (; iVar17 != iVar14; iVar17 = iVar17 + 1) {
              piVar16 = &ptVar4[local_e0].ly;
              for (uVar18 = 0; iVar9 != (int)uVar18; uVar18 = uVar18 + 1) {
                iVar12 = exr_read_tile_chunk_info
                                   (*(this->_ctxt)._ctxt.
                                     super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,((this->_data).
                                              super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->partNumber,uVar18 & 0xffffffff,iVar17,iVar8,
                                    iVar11,&cinfo);
                if (iVar12 != 0) {
                  pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(pAVar13,"Unable to get tile offset.");
                  __cxa_throw(pAVar13,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                }
                ((tilepos *)(piVar16 + -5))->filePos = cinfo.data_offset;
                piVar16[-3] = (int)uVar18;
                piVar16[-2] = iVar17;
                piVar16[-1] = iVar8;
                *piVar16 = iVar11;
                piVar16 = piVar16 + 6;
              }
              local_e0 = local_e0 + uVar18;
            }
          }
        }
      }
      if (ptVar4 != ptVar5) {
        uVar18 = ((long)ptVar5 - (long)ptVar4) / 0x18;
        lVar3 = 0x3f;
        if (uVar18 != 0) {
          for (; uVar18 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos*,std::vector<Imf_3_4::(anonymous_namespace)::tilepos,std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (ptVar4,ptVar5,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)ptVar5 - (long)ptVar4 < 0x181) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos*,std::vector<Imf_3_4::(anonymous_namespace)::tilepos,std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (ptVar4,ptVar5);
        }
        else {
          ptVar15 = ptVar4 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos*,std::vector<Imf_3_4::(anonymous_namespace)::tilepos,std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (ptVar4,ptVar15);
          for (; ptVar15 != ptVar5; ptVar15 = ptVar15 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos*,std::vector<Imf_3_4::(anonymous_namespace)::tilepos,std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>>>,__gnu_cxx::__ops::_Val_less_iter>
                      (ptVar15);
          }
        }
      }
      piVar16 = &ptVar4->ly;
      for (uVar18 = 0; local_d8 != uVar18; uVar18 = uVar18 + 1) {
        dx[uVar18] = piVar16[-3];
        dy[uVar18] = piVar16[-2];
        lx[uVar18] = piVar16[-1];
        ly[uVar18] = *piVar16;
        piVar16 = piVar16 + 6;
      }
      std::
      vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
      ::~vector(&table);
      return;
    }
    if (eVar6 != EXR_LINEORDER_DECREASING_Y) {
      pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar13,"Unknown LineOrder.");
LAB_001711a8:
      __cxa_throw(pAVar13,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    *dx = 0;
    iVar7 = numYTiles(this,0);
    *dy = iVar7 + -1;
  }
  *lx = 0;
  *ly = 0;
  return;
}

Assistant:

void
DeepTiledInputFile::getTileOrder (int dx[], int dy[], int lx[], int ly[]) const
{
    // TODO: remove once TiledOutputFile copy is converted
    switch (_ctxt.lineOrder (_data->partNumber))
    {
        case EXR_LINEORDER_RANDOM_Y:
            // calc below outside the nest
            break;

        case EXR_LINEORDER_DECREASING_Y:
        {
            dx[0] = 0;
            dy[0] = numYTiles (0) - 1;
            lx[0] = 0;
            ly[0] = 0;
            return;
        }
        case EXR_LINEORDER_INCREASING_Y:
            dx[0] = 0;
            dy[0] = 0;
            lx[0] = 0;
            ly[0] = 0;
            return;

        case EXR_LINEORDER_LAST_TYPE: /* invalid but should never be here */
        default:
            throw IEX_NAMESPACE::ArgExc ("Unknown LineOrder.");
    }

    size_t numAllTiles = 0;
    int numX = numXLevels ();
    int numY = numYLevels ();

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:
            for (int i_l = 0; i_l < numY; ++i_l)
                numAllTiles += size_t (numXTiles (i_l)) * size_t (numYTiles (i_l));
            break;

        case RIPMAP_LEVELS:
            for (int i_ly = 0; i_ly < numY; ++i_ly)
                for (int i_lx = 0; i_lx < numX; ++i_lx)
                    numAllTiles += size_t (numXTiles (i_lx)) * size_t (numYTiles (i_ly));
            break;

        default:
            throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    std::vector<tilepos> table;

    table.resize (numAllTiles);
    size_t tIdx = 0;
    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:
            for (int i_l = 0; i_l < numY; ++i_l)
            {
                int nY = numYTiles (i_l);
                int nX = numXTiles (i_l);

                for ( int y = 0; y < nY; ++y )
                    for ( int x = 0; x < nX; ++x )
                    {
                        exr_chunk_info_t cinfo;
                        if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
                                _ctxt, _data->partNumber, x, y, i_l, i_l, &cinfo))
                        {
                            tilepos &tp = table[tIdx++];
                            tp.filePos = cinfo.data_offset;
                            tp.dx = x;
                            tp.dy = y;
                            tp.lx = i_l;
                            tp.ly = i_l;
                        }
                        else
                        {
                            throw IEX_NAMESPACE::ArgExc ("Unable to get tile offset.");
                        }
                    }
            }
            break;

        case RIPMAP_LEVELS:
            for (int i_ly = 0; i_ly < numY; ++i_ly)
            {
                int nY = numYTiles (i_ly);
                for (int i_lx = 0; i_lx < numX; ++i_lx)
                {
                    int nX = numXTiles (i_lx);
                    for ( int y = 0; y < nY; ++y )
                        for ( int x = 0; x < nX; ++x )
                        {
                            exr_chunk_info_t cinfo;
                            if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
                                    _ctxt, _data->partNumber, x, y, i_lx, i_ly, &cinfo))
                            {
                                tilepos &tp = table[tIdx++];
                                tp.filePos = cinfo.data_offset;
                                tp.dx = x;
                                tp.dy = y;
                                tp.lx = i_lx;
                                tp.ly = i_ly;
                            }
                            else
                            {
                                throw IEX_NAMESPACE::ArgExc ("Unable to get tile offset.");
                            }
                        }
                }
            }
            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    std::sort (table.begin(), table.end ());

    for (size_t i = 0; i < numAllTiles; ++i)
    {
        const auto& tp = table[i];
        dx[i] = tp.dx;
        dy[i] = tp.dy;
        lx[i] = tp.lx;
        ly[i] = tp.ly;
    }
}